

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

void __thiscall google::protobuf::internal::MicroString::ClearSlow(MicroString *this)

{
  bool bVar1;
  LargeRepKind LVar2;
  MicroRep *this_00;
  LargeRep *pLVar3;
  StringRep *this_01;
  MicroRep *rep_1;
  StringRep *rep;
  MicroString *this_local;
  
  bVar1 = is_micro_rep(this);
  if (bVar1) {
    this_00 = micro_rep(this);
    MicroRep::ChangeSize(this_00,'\0');
  }
  else {
    LVar2 = large_rep_kind(this);
    switch(LVar2) {
    case kAlias:
      pLVar3 = large_rep(this);
      *(undefined1 *)((long)&pLVar3->payload + 1) = 0xe;
      MicroRep::SetInitialSize((MicroRep *)pLVar3,'\0');
      this->rep_ = (void *)((long)&pLVar3->payload + 2);
      break;
    case kUnowned:
      InitDefault(this);
      break;
    case kString:
      this_01 = string_rep(this);
      std::__cxx11::string::clear();
      StringRep::ResetBase(this_01);
      break;
    case kOwned:
      pLVar3 = large_rep(this);
      LargeRep::ChangeSize(pLVar3,0);
    }
  }
  return;
}

Assistant:

void MicroString::ClearSlow() {
  if (is_micro_rep()) {
    micro_rep()->ChangeSize(0);
    return;
  }

  switch (large_rep_kind()) {
    case kOwned:
      large_rep()->ChangeSize(0);
      return;
    case kString: {
      auto* rep = string_rep();
      rep->str.clear();
      rep->ResetBase();
      return;
    }
    case kAlias: {
      // We have a large rep we can't really use much.
      // Transform it into a micro rep to use the space for something.
      MicroRep* rep = reinterpret_cast<MicroRep*>(large_rep());
      rep->capacity = sizeof(LargeRep) - sizeof(MicroRep);
      rep->SetInitialSize(0);
      rep_ = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(rep) +
                                     kIsMicroRepTag);
      return;
    }
    case kUnowned:
      // We don't own any memory, so just reset to default.
      InitDefault();
      break;
  }
}